

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_set_context(ptls_t *tls,ptls_context_t *ctx)

{
  ptls_context_t *ctx_local;
  ptls_t *tls_local;
  
  update_open_count(ctx,1);
  update_open_count(tls->ctx,-1);
  tls->ctx = ctx;
  return;
}

Assistant:

void ptls_set_context(ptls_t *tls, ptls_context_t *ctx)
{
    update_open_count(ctx, 1);
    update_open_count(tls->ctx, -1);
    tls->ctx = ctx;
}